

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmenet.c
# Opt level: O1

void enet_service_network_lock(CManager cm,void *void_trans)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)((long)void_trans + 0x98) + 0x18);
  (**(code **)(lVar1 + 0xb0))
            (cm,
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmenet.c"
             ,0x1fd);
  enet_service_network(cm,void_trans);
  (**(code **)(lVar1 + 0xa8))
            (cm,
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmenet.c"
             ,0x1ff);
  return;
}

Assistant:

static
void
enet_service_network_lock(CManager cm, void *void_trans)
{
    transport_entry trans = (transport_entry) void_trans;
    enet_client_data_ptr ecd = (enet_client_data_ptr) trans->trans_data;
    CMtrans_services svc = ecd->svc;
    ACQUIRE_CM_LOCK(svc, cm);
    enet_service_network(cm, void_trans);
    DROP_CM_LOCK(svc, cm);
}